

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JPG.cpp
# Opt level: O0

uint getRawBit(int value,uint length)

{
  runtime_error *this;
  uint local_24;
  uint local_20;
  uint temp;
  uint rawBit;
  uint local_10;
  uint length_local;
  int value_local;
  
  if (length != 0) {
    local_20 = value;
    if (value < 1) {
      local_24 = 1;
      for (local_10 = length; 1 < local_10; local_10 = local_10 - 1) {
        local_24 = local_24 * 2 + 1;
      }
      local_20 = (-value ^ 0xffffffffU) & local_24;
    }
    return local_20;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Error - Length 0 is not allowed");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

uint getRawBit(int value, uint length) {
	if (length == 0)
		throw std::runtime_error("Error - Length 0 is not allowed");
	uint rawBit;
	if (value > 0) {
		rawBit = value;
	} else {
        uint temp = 1;
        while(length > 1) {
            temp = (temp << 1) + 1;
            length--;
        }
		rawBit = (-value);
		rawBit = (~rawBit) & temp;
	}
	return rawBit;
}